

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_striped_sse41_128_32.c
# Opt level: O3

parasail_result_t *
parasail_sg_flags_rowcol_striped_profile_sse41_128_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  int *piVar1;
  uint *puVar2;
  undefined4 *puVar3;
  uint uVar4;
  uint uVar5;
  void *pvVar6;
  parasail_matrix_t *ppVar7;
  bool bVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  parasail_result_t *ppVar15;
  __m128i *ptr;
  __m128i *palVar16;
  __m128i *ptr_00;
  int32_t *ptr_01;
  uint uVar17;
  int32_t iVar18;
  int iVar19;
  ulong size;
  long lVar20;
  int iVar21;
  int iVar22;
  uint uVar23;
  ulong uVar24;
  __m128i *palVar25;
  __m128i *palVar26;
  char *pcVar27;
  uint uVar28;
  ulong uVar29;
  int iVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  ulong uVar39;
  undefined1 auVar40 [16];
  uint uVar41;
  uint uVar43;
  uint uVar44;
  undefined1 auVar42 [16];
  uint uVar45;
  int iVar47;
  undefined1 auVar46 [16];
  int iVar48;
  int iVar54;
  int iVar55;
  undefined1 auVar49 [16];
  int iVar56;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  int iVar57;
  int iVar61;
  int iVar62;
  undefined1 in_XMM9 [16];
  undefined1 auVar58 [16];
  int iVar63;
  undefined1 auVar59 [16];
  __m128i alVar60;
  int iVar64;
  int iVar67;
  int iVar68;
  undefined1 in_XMM10 [16];
  undefined1 auVar65 [16];
  int iVar69;
  undefined1 auVar66 [16];
  uint uVar70;
  uint uVar72;
  uint uVar73;
  __m128i alVar71;
  uint uVar74;
  undefined1 in_XMM12 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 in_XMM13 [16];
  undefined1 auVar77 [16];
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sg_flags_rowcol_striped_profile_sse41_128_32_cold_8();
  }
  else {
    pvVar6 = (profile->profile32).score;
    if (pvVar6 == (void *)0x0) {
      parasail_sg_flags_rowcol_striped_profile_sse41_128_32_cold_7();
    }
    else {
      ppVar7 = profile->matrix;
      if (ppVar7 == (parasail_matrix_t *)0x0) {
        parasail_sg_flags_rowcol_striped_profile_sse41_128_32_cold_6();
      }
      else {
        uVar4 = profile->s1Len;
        if ((int)uVar4 < 1) {
          parasail_sg_flags_rowcol_striped_profile_sse41_128_32_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sg_flags_rowcol_striped_profile_sse41_128_32_cold_4();
        }
        else if (s2Len < 1) {
          parasail_sg_flags_rowcol_striped_profile_sse41_128_32_cold_3();
        }
        else if (open < 0) {
          parasail_sg_flags_rowcol_striped_profile_sse41_128_32_cold_2();
        }
        else if (gap < 0) {
          parasail_sg_flags_rowcol_striped_profile_sse41_128_32_cold_1();
        }
        else {
          uVar23 = uVar4 - 1;
          uVar29 = (ulong)uVar4 + 3;
          size = uVar29 >> 2;
          uVar39 = (ulong)uVar23 % size;
          iVar13 = (int)(uVar23 / size);
          iVar22 = -open;
          iVar19 = ppVar7->min;
          uVar17 = 0x80000000 - iVar19;
          if (iVar19 != iVar22 && SBORROW4(iVar19,iVar22) == iVar19 + open < 0) {
            uVar17 = open | 0x80000000;
          }
          uVar14 = 0x7ffffffe - ppVar7->max;
          ppVar15 = parasail_result_new_rowcol1((uint)uVar29 & 0x7ffffffc,s2Len);
          if (ppVar15 != (parasail_result_t *)0x0) {
            ppVar15->flag =
                 (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe |
                 (uint)(s2_end != 0) << 0xf | ppVar15->flag | 0x4440802;
            ptr = parasail_memalign___m128i(0x10,size);
            palVar16 = parasail_memalign___m128i(0x10,size);
            ptr_00 = parasail_memalign___m128i(0x10,size);
            ptr_01 = parasail_memalign_int32_t(0x10,(ulong)(s2Len + 1));
            if ((ptr_01 != (int32_t *)0x0 && ptr_00 != (__m128i *)0x0) &&
                (palVar16 != (__m128i *)0x0 && ptr != (__m128i *)0x0)) {
              iVar19 = s2Len + -1;
              iVar21 = -iVar13 + 3;
              uVar17 = uVar17 + 1;
              auVar37._4_4_ = uVar17;
              auVar37._0_4_ = uVar17;
              auVar37._8_4_ = uVar17;
              auVar37._12_4_ = uVar17;
              auVar42._4_4_ = iVar22;
              auVar42._0_4_ = iVar22;
              auVar42._8_4_ = iVar22;
              auVar42._12_4_ = iVar22;
              auVar46._0_8_ = CONCAT44(0,open);
              auVar46._8_4_ = open;
              auVar46._12_4_ = 0;
              uVar28 = (uint)size;
              auVar49._8_4_ = uVar28;
              auVar49._0_8_ = size;
              auVar49._12_4_ = 0;
              auVar58 = pmovsxbq(in_XMM9,0x302);
              auVar58 = pmuldq(auVar58,auVar49);
              auVar49 = pmuldq(auVar49,_DAT_00903a90);
              uVar24 = 0;
              auVar65 = pmovsxdq(in_XMM10,0x8000000080000000);
              palVar25 = ptr;
              palVar26 = ptr_00;
              do {
                if (s1_beg == 0) {
                  auVar77._8_4_ = (int)uVar24;
                  auVar77._0_8_ = uVar24;
                  auVar77._12_4_ = (int)(uVar24 >> 0x20);
                  auVar31._0_4_ = (undefined4)(uVar24 + auVar49._0_8_);
                  auVar31._4_4_ = (int)(auVar77._8_8_ + auVar49._8_8_);
                  auVar31._8_4_ = (int)(auVar58._0_8_ + uVar24);
                  auVar31._12_4_ = (int)(auVar58._8_8_ + auVar77._8_8_);
                  auVar75._4_4_ = gap;
                  auVar75._0_4_ = gap;
                  auVar75._8_4_ = gap;
                  auVar75._12_4_ = gap;
                  auVar75 = pmulld(auVar31,auVar75);
                  alVar71[0]._0_4_ = iVar22 - auVar75._0_4_;
                  alVar71[0]._4_4_ = iVar22 - auVar75._4_4_;
                  alVar71[1]._0_4_ = iVar22 - auVar75._8_4_;
                  alVar71[1]._4_4_ = iVar22 - auVar75._12_4_;
                }
                else {
                  alVar71[0] = 0;
                  alVar71[1] = 0;
                }
                auVar75 = pmovsxdq(in_XMM12,(undefined1  [16])alVar71);
                auVar32._0_8_ = alVar71[1];
                auVar32._8_4_ = (int)alVar71[1];
                auVar32._12_4_ = alVar71[1]._4_4_;
                auVar77 = pmovsxdq(in_XMM13,auVar32);
                in_XMM13._0_8_ = auVar77._0_8_ - auVar46._0_8_;
                in_XMM13._8_8_ = auVar77._8_8_ - (ulong)(uint)open;
                auVar76._0_8_ = auVar75._0_8_ - auVar46._0_8_;
                auVar76._8_8_ = auVar75._8_8_ - (ulong)(uint)open;
                auVar33._0_8_ = -(ulong)(auVar65._0_8_ < auVar76._0_8_);
                auVar33._8_8_ = -(ulong)(auVar65._8_8_ < auVar76._8_8_);
                auVar75 = blendvpd(auVar65,auVar76,auVar33);
                auVar34._0_8_ = -(ulong)(auVar65._0_8_ < in_XMM13._0_8_);
                auVar34._8_8_ = -(ulong)(auVar65._8_8_ < in_XMM13._8_8_);
                in_XMM12 = blendvpd(auVar65,in_XMM13,auVar34);
                *palVar25 = alVar71;
                *(int *)*palVar26 = auVar75._0_4_;
                *(int *)((long)*palVar26 + 4) = auVar75._8_4_;
                *(int *)(*palVar26 + 1) = in_XMM12._0_4_;
                *(int *)((long)*palVar26 + 0xc) = in_XMM12._8_4_;
                uVar24 = uVar24 + 1;
                palVar26 = palVar26 + 1;
                palVar25 = palVar25 + 1;
              } while (size != uVar24);
              *ptr_01 = 0;
              auVar49 = _DAT_00906ca0;
              lVar20 = (ulong)(uint)s2Len - 1;
              auVar58._8_4_ = (int)lVar20;
              auVar58._0_8_ = lVar20;
              auVar58._12_4_ = (int)((ulong)lVar20 >> 0x20);
              auVar42 = pmovsxbq(auVar42,0x302);
              auVar46 = pmovsxbq(auVar46,0x100);
              auVar58 = auVar58 ^ _DAT_00906ca0;
              uVar24 = 0;
              iVar30 = iVar22;
              do {
                alVar60[1] = auVar49._0_8_;
                lVar20 = auVar58._0_8_;
                if ((bool)(~(lVar20 < (long)(uVar24 ^ alVar60[1])) & 1)) {
                  iVar18 = 0;
                  if (s2_beg == 0) {
                    iVar18 = iVar30;
                  }
                  ptr_01[uVar24 + 1] = iVar18;
                }
                auVar65._8_4_ = (int)uVar24;
                auVar65._0_8_ = uVar24;
                auVar65._12_4_ = (int)(uVar24 >> 0x20);
                if ((long)((auVar65._8_8_ | auVar46._8_8_) ^ auVar49._8_8_) <= auVar58._8_8_) {
                  iVar61 = iVar30 - gap;
                  if (s2_beg != 0) {
                    iVar61 = 0;
                  }
                  ptr_01[uVar24 + 2] = iVar61;
                }
                bVar8 = (long)((uVar24 | auVar42._0_8_) ^ alVar60[1]) <= lVar20;
                if (bVar8) {
                  iVar61 = gap * -2 + iVar30;
                  if (s2_beg != 0) {
                    iVar61 = 0;
                  }
                  ptr_01[uVar24 + 3] = iVar61;
                }
                if (bVar8) {
                  iVar61 = gap * -3 + iVar30;
                  if (s2_beg != 0) {
                    iVar61 = 0;
                  }
                  ptr_01[uVar24 + 4] = iVar61;
                }
                uVar24 = uVar24 + 4;
                iVar30 = iVar30 + gap * -4;
              } while ((s2Len + 3U & 0xfffffffc) != uVar24);
              uVar24 = 0;
              auVar40._0_4_ = -(uint)(iVar21 == 3);
              auVar40._4_4_ = -(uint)(iVar21 == 2);
              auVar40._8_4_ = -(uint)(iVar21 == 1);
              auVar40._12_4_ = -(uint)(-iVar13 == -3);
              auVar35 = auVar37;
              auVar52 = auVar37;
              iVar30 = iVar19;
              uVar41 = uVar14;
              uVar43 = uVar14;
              uVar44 = uVar14;
              uVar45 = uVar14;
              do {
                palVar25 = ptr;
                ptr = palVar16;
                iVar47 = ppVar7->mapper[(byte)s2[uVar24]];
                palVar16 = palVar25 + (uVar28 - 1);
                iVar61 = (int)(*palVar16)[0];
                iVar62 = *(int *)((long)*palVar16 + 4);
                iVar63 = (int)(*palVar16)[1];
                iVar18 = ptr_01[uVar24];
                lVar20 = 0;
                auVar42 = auVar35;
                auVar51 = auVar37;
                do {
                  piVar1 = (int *)((long)pvVar6 + lVar20 + (long)iVar47 * size * 0x10);
                  iVar57 = iVar18 + *piVar1;
                  iVar61 = iVar61 + piVar1[1];
                  iVar62 = iVar62 + piVar1[2];
                  iVar63 = iVar63 + piVar1[3];
                  piVar1 = (int *)((long)*ptr_00 + lVar20);
                  iVar64 = *piVar1;
                  iVar67 = piVar1[1];
                  iVar68 = piVar1[2];
                  iVar69 = piVar1[3];
                  iVar48 = auVar51._0_4_;
                  uVar70 = (uint)(iVar64 < iVar48) * iVar48 | (uint)(iVar64 >= iVar48) * iVar64;
                  iVar54 = auVar51._4_4_;
                  uVar72 = (uint)(iVar67 < iVar54) * iVar54 | (uint)(iVar67 >= iVar54) * iVar67;
                  iVar55 = auVar51._8_4_;
                  uVar73 = (uint)(iVar68 < iVar55) * iVar55 | (uint)(iVar68 >= iVar55) * iVar68;
                  iVar56 = auVar51._12_4_;
                  uVar74 = (uint)(iVar69 < iVar56) * iVar56 | (uint)(iVar69 >= iVar56) * iVar69;
                  uVar70 = (uint)((int)uVar70 < iVar57) * iVar57 | ((int)uVar70 >= iVar57) * uVar70;
                  uVar72 = (uint)((int)uVar72 < iVar61) * iVar61 | ((int)uVar72 >= iVar61) * uVar72;
                  uVar73 = (uint)((int)uVar73 < iVar62) * iVar62 | ((int)uVar73 >= iVar62) * uVar73;
                  uVar74 = (uint)((int)uVar74 < iVar63) * iVar63 | ((int)uVar74 >= iVar63) * uVar74;
                  puVar2 = (uint *)((long)*ptr + lVar20);
                  *puVar2 = uVar70;
                  puVar2[1] = uVar72;
                  puVar2[2] = uVar73;
                  puVar2[3] = uVar74;
                  iVar61 = auVar42._0_4_;
                  auVar35._0_4_ =
                       (iVar61 < (int)uVar70) * uVar70 | (uint)(iVar61 >= (int)uVar70) * iVar61;
                  iVar61 = auVar42._4_4_;
                  auVar35._4_4_ =
                       (iVar61 < (int)uVar72) * uVar72 | (uint)(iVar61 >= (int)uVar72) * iVar61;
                  iVar61 = auVar42._8_4_;
                  iVar62 = auVar42._12_4_;
                  auVar35._8_4_ =
                       (iVar61 < (int)uVar73) * uVar73 | (uint)(iVar61 >= (int)uVar73) * iVar61;
                  auVar35._12_4_ =
                       (iVar62 < (int)uVar74) * uVar74 | (uint)(iVar62 >= (int)uVar74) * iVar62;
                  uVar41 = (uint)(iVar64 < (int)uVar41) * iVar64 | (iVar64 >= (int)uVar41) * uVar41;
                  uVar43 = (uint)(iVar67 < (int)uVar43) * iVar67 | (iVar67 >= (int)uVar43) * uVar43;
                  uVar44 = (uint)(iVar68 < (int)uVar44) * iVar68 | (iVar68 >= (int)uVar44) * uVar44;
                  uVar45 = (uint)(iVar69 < (int)uVar45) * iVar69 | (iVar69 >= (int)uVar45) * uVar45;
                  uVar41 = (uint)(iVar48 < (int)uVar41) * iVar48 | (iVar48 >= (int)uVar41) * uVar41;
                  uVar43 = (uint)(iVar54 < (int)uVar43) * iVar54 | (iVar54 >= (int)uVar43) * uVar43;
                  uVar44 = (uint)(iVar55 < (int)uVar44) * iVar55 | (iVar55 >= (int)uVar44) * uVar44;
                  uVar45 = (uint)(iVar56 < (int)uVar45) * iVar56 | (iVar56 >= (int)uVar45) * uVar45;
                  uVar41 = ((int)uVar70 < (int)uVar41) * uVar70 |
                           ((int)uVar70 >= (int)uVar41) * uVar41;
                  uVar43 = ((int)uVar72 < (int)uVar43) * uVar72 |
                           ((int)uVar72 >= (int)uVar43) * uVar43;
                  uVar44 = ((int)uVar73 < (int)uVar44) * uVar73 |
                           ((int)uVar73 >= (int)uVar44) * uVar44;
                  uVar45 = ((int)uVar74 < (int)uVar45) * uVar74 |
                           ((int)uVar74 >= (int)uVar45) * uVar45;
                  iVar61 = uVar70 - open;
                  iVar62 = uVar72 - open;
                  iVar63 = uVar73 - open;
                  iVar57 = uVar74 - open;
                  iVar64 = iVar64 - gap;
                  iVar67 = iVar67 - gap;
                  iVar68 = iVar68 - gap;
                  iVar69 = iVar69 - gap;
                  puVar2 = (uint *)((long)*ptr_00 + lVar20);
                  *puVar2 = (uint)(iVar64 < iVar61) * iVar61 | (uint)(iVar64 >= iVar61) * iVar64;
                  puVar2[1] = (uint)(iVar67 < iVar62) * iVar62 | (uint)(iVar67 >= iVar62) * iVar67;
                  puVar2[2] = (uint)(iVar68 < iVar63) * iVar63 | (uint)(iVar68 >= iVar63) * iVar68;
                  puVar2[3] = (uint)(iVar69 < iVar57) * iVar57 | (uint)(iVar69 >= iVar57) * iVar69;
                  iVar48 = iVar48 - gap;
                  iVar54 = iVar54 - gap;
                  iVar55 = iVar55 - gap;
                  iVar56 = iVar56 - gap;
                  auVar51._0_4_ =
                       (uint)(iVar48 < iVar61) * iVar61 | (uint)(iVar48 >= iVar61) * iVar48;
                  auVar51._4_4_ =
                       (uint)(iVar54 < iVar62) * iVar62 | (uint)(iVar54 >= iVar62) * iVar54;
                  auVar51._8_4_ =
                       (uint)(iVar55 < iVar63) * iVar63 | (uint)(iVar55 >= iVar63) * iVar55;
                  auVar51._12_4_ =
                       (uint)(iVar56 < iVar57) * iVar57 | (uint)(iVar56 >= iVar57) * iVar56;
                  piVar1 = (int *)((long)*palVar25 + lVar20);
                  iVar18 = *piVar1;
                  iVar61 = piVar1[1];
                  iVar62 = piVar1[2];
                  iVar63 = piVar1[3];
                  lVar20 = lVar20 + 0x10;
                  auVar42 = auVar35;
                } while (size << 4 != lVar20);
                iVar61 = 0;
                pcVar27 = s2;
                do {
                  iVar62 = iVar22;
                  if (s2_beg == 0) {
                    iVar62 = ptr_01[uVar24 + 1] - open;
                  }
                  auVar50._0_4_ = auVar51._0_4_;
                  auVar50._4_4_ = auVar50._0_4_;
                  auVar50._8_4_ = auVar51._4_4_;
                  auVar50._12_4_ = auVar51._8_4_;
                  auVar51._4_4_ = auVar50._0_4_;
                  auVar51._0_4_ = iVar62;
                  auVar51._8_8_ = auVar50._8_8_;
                  lVar20 = 0;
                  auVar42 = auVar35;
                  do {
                    piVar1 = (int *)((long)*ptr + lVar20);
                    iVar63 = *piVar1;
                    iVar47 = piVar1[1];
                    iVar48 = piVar1[2];
                    iVar54 = piVar1[3];
                    iVar62 = auVar51._0_4_;
                    uVar70 = (uint)(iVar63 < iVar62) * iVar62 | (uint)(iVar63 >= iVar62) * iVar63;
                    iVar63 = auVar51._4_4_;
                    uVar72 = (uint)(iVar47 < iVar63) * iVar63 | (uint)(iVar47 >= iVar63) * iVar47;
                    iVar47 = auVar51._8_4_;
                    uVar73 = (uint)(iVar48 < iVar47) * iVar47 | (uint)(iVar48 >= iVar47) * iVar48;
                    iVar48 = auVar51._12_4_;
                    uVar74 = (uint)(iVar54 < iVar48) * iVar48 | (uint)(iVar54 >= iVar48) * iVar54;
                    puVar2 = (uint *)((long)*ptr + lVar20);
                    *puVar2 = uVar70;
                    puVar2[1] = uVar72;
                    puVar2[2] = uVar73;
                    puVar2[3] = uVar74;
                    uVar41 = ((int)uVar70 < (int)uVar41) * uVar70 |
                             ((int)uVar70 >= (int)uVar41) * uVar41;
                    uVar43 = ((int)uVar72 < (int)uVar43) * uVar72 |
                             ((int)uVar72 >= (int)uVar43) * uVar43;
                    uVar44 = ((int)uVar73 < (int)uVar44) * uVar73 |
                             ((int)uVar73 >= (int)uVar44) * uVar44;
                    uVar45 = ((int)uVar74 < (int)uVar45) * uVar74 |
                             ((int)uVar74 >= (int)uVar45) * uVar45;
                    iVar54 = auVar42._0_4_;
                    auVar35._0_4_ =
                         (iVar54 < (int)uVar70) * uVar70 | (uint)(iVar54 >= (int)uVar70) * iVar54;
                    iVar54 = auVar42._4_4_;
                    auVar35._4_4_ =
                         (iVar54 < (int)uVar72) * uVar72 | (uint)(iVar54 >= (int)uVar72) * iVar54;
                    iVar54 = auVar42._8_4_;
                    iVar55 = auVar42._12_4_;
                    auVar35._8_4_ =
                         (iVar54 < (int)uVar73) * uVar73 | (uint)(iVar54 >= (int)uVar73) * iVar54;
                    auVar35._12_4_ =
                         (iVar55 < (int)uVar74) * uVar74 | (uint)(iVar55 >= (int)uVar74) * iVar55;
                    auVar51._0_4_ = iVar62 - gap;
                    auVar51._4_4_ = iVar63 - gap;
                    auVar51._8_4_ = iVar47 - gap;
                    auVar51._12_4_ = iVar48 - gap;
                    auVar66._0_4_ = -(uint)((int)(uVar70 - open) < (int)auVar51._0_4_);
                    auVar66._4_4_ = -(uint)((int)(uVar72 - open) < (int)auVar51._4_4_);
                    auVar66._8_4_ = -(uint)((int)(uVar73 - open) < (int)auVar51._8_4_);
                    auVar66._12_4_ = -(uint)((int)(uVar74 - open) < (int)auVar51._12_4_);
                    uVar70 = movmskps((int)pcVar27,auVar66);
                    pcVar27 = (char *)(ulong)uVar70;
                    if (uVar70 == 0) goto LAB_00710a95;
                    lVar20 = lVar20 + 0x10;
                    auVar42 = auVar35;
                  } while (size << 4 != lVar20);
                  iVar61 = iVar61 + 1;
                } while (iVar61 != 4);
LAB_00710a95:
                alVar60 = ptr[uVar39];
                iVar62 = auVar52._0_4_;
                iVar54 = (int)alVar60[0];
                auVar59._0_4_ = -(uint)(iVar62 < iVar54);
                iVar63 = auVar52._4_4_;
                iVar55 = alVar60[0]._4_4_;
                auVar59._4_4_ = -(uint)(iVar63 < iVar55);
                iVar47 = auVar52._8_4_;
                iVar56 = (int)alVar60[1];
                iVar64 = alVar60[1]._4_4_;
                auVar59._8_4_ = -(uint)(iVar47 < iVar56);
                iVar48 = auVar52._12_4_;
                auVar59._12_4_ = -(uint)(iVar48 < iVar64);
                iVar61 = movmskps((int)lVar20,auVar59 & auVar40);
                if (iVar61 != 0) {
                  iVar30 = (int)uVar24;
                }
                if (iVar13 < 3) {
                  iVar61 = 0;
                  do {
                    lVar20 = alVar60[1];
                    alVar60[1] = alVar60[0];
                    alVar60[0] = alVar60[1] << 0x20;
                    alVar60[1] = lVar20 << 0x20 | alVar60[1] >> 0x20;
                    iVar61 = iVar61 + 1;
                  } while (iVar61 < iVar21);
                }
                ((ppVar15->field_4).rowcols)->score_row[uVar24] = (int)(alVar60[1] >> 0x20);
                auVar52._0_4_ = (uint)(iVar54 < iVar62) * iVar62 | (uint)(iVar54 >= iVar62) * iVar54
                ;
                auVar52._4_4_ = (uint)(iVar55 < iVar63) * iVar63 | (uint)(iVar55 >= iVar63) * iVar55
                ;
                auVar52._8_4_ = (uint)(iVar56 < iVar47) * iVar47 | (uint)(iVar56 >= iVar47) * iVar56
                ;
                auVar52._12_4_ =
                     (uint)(iVar64 < iVar48) * iVar48 | (uint)(iVar64 >= iVar48) * iVar64;
                uVar24 = uVar24 + 1;
                palVar16 = palVar25;
                if (uVar24 == (uint)s2Len) {
                  lVar20 = 0;
                  do {
                    puVar3 = (undefined4 *)((long)*ptr + lVar20 * 4);
                    uVar9 = puVar3[1];
                    uVar10 = puVar3[2];
                    uVar11 = puVar3[3];
                    piVar1 = ((ppVar15->field_4).rowcols)->score_col;
                    *(undefined4 *)((long)piVar1 + lVar20) = *puVar3;
                    *(undefined4 *)((long)piVar1 + size * 4 + lVar20) = uVar9;
                    *(undefined4 *)((long)piVar1 + size * 8 + lVar20) = uVar10;
                    *(undefined4 *)((long)piVar1 + size * 0xc + lVar20) = uVar11;
                    lVar20 = lVar20 + 4;
                  } while (size * 4 - lVar20 != 0);
                  uVar70 = uVar17;
                  if ((s2_end != 0) && (uVar70 = auVar52._12_4_, iVar13 < 3)) {
                    iVar22 = 0;
                    do {
                      auVar53._0_8_ = auVar52._0_8_ << 0x20;
                      auVar53._8_8_ = auVar52._8_8_ << 0x20 | auVar52._0_8_ >> 0x20;
                      uVar70 = auVar52._8_4_;
                      iVar22 = iVar22 + 1;
                      auVar52 = auVar53;
                    } while (iVar22 < iVar21);
                  }
                  uVar72 = uVar23;
                  if ((s1_end != 0) && ((uVar29 & 0x7ffffffc) != 0)) {
                    uVar29 = 0;
                    do {
                      uVar73 = ((uint)uVar29 & 3) * uVar28 + ((uint)(uVar29 >> 2) & 0x3fffffff);
                      iVar22 = iVar30;
                      uVar74 = uVar72;
                      uVar12 = uVar70;
                      if (((int)uVar73 < (int)uVar4) &&
                         (uVar5 = *(uint *)((long)*ptr + uVar29 * 4), iVar22 = iVar19,
                         uVar74 = uVar73, uVar12 = uVar5, (int)uVar5 <= (int)uVar70)) {
                        if ((int)uVar72 <= (int)uVar73) {
                          uVar73 = uVar72;
                        }
                        iVar22 = iVar30;
                        uVar74 = uVar72;
                        uVar12 = uVar70;
                        if (iVar30 == iVar19 && uVar5 == uVar70) {
                          uVar74 = uVar73;
                        }
                      }
                      uVar70 = uVar12;
                      uVar72 = uVar74;
                      iVar30 = iVar22;
                      uVar29 = uVar29 + 1;
                    } while ((uVar28 & 0x1fffffff) << 2 != (int)uVar29);
                  }
                  if (s2_end == 0 && s1_end == 0) {
                    s1_end = (int)uVar39 * 0x10;
                    uVar29 = ptr[uVar39][1];
                    if (iVar13 < 3) {
                      s1_end = 0;
                      uVar39 = ptr[uVar39][0];
                      do {
                        uVar29 = uVar29 << 0x20 | uVar39 >> 0x20;
                        s1_end = s1_end + 1;
                        uVar39 = uVar39 << 0x20;
                      } while (s1_end < iVar21);
                    }
                    uVar70 = (uint)(uVar29 >> 0x20);
                    iVar30 = iVar19;
                    uVar72 = uVar23;
                  }
                  auVar38._0_4_ = -(uint)((int)uVar41 < (int)uVar17);
                  auVar38._4_4_ = -(uint)((int)uVar43 < (int)uVar17);
                  auVar38._8_4_ = -(uint)((int)uVar44 < (int)uVar17);
                  auVar38._12_4_ = -(uint)((int)uVar45 < (int)uVar17);
                  auVar36._0_4_ = -(uint)((int)uVar14 < (int)auVar35._0_4_);
                  auVar36._4_4_ = -(uint)((int)uVar14 < (int)auVar35._4_4_);
                  auVar36._8_4_ = -(uint)((int)uVar14 < (int)auVar35._8_4_);
                  auVar36._12_4_ = -(uint)((int)uVar14 < (int)auVar35._12_4_);
                  iVar19 = movmskps(s1_end,auVar36 | auVar38);
                  if (iVar19 != 0) {
                    *(byte *)&ppVar15->flag = (byte)ppVar15->flag | 0x40;
                    uVar70 = 0;
                    iVar30 = 0;
                    uVar72 = 0;
                  }
                  ppVar15->score = uVar70;
                  ppVar15->end_query = uVar72;
                  ppVar15->end_ref = iVar30;
                  parasail_free(ptr_01);
                  parasail_free(ptr_00);
                  parasail_free(palVar25);
                  parasail_free(ptr);
                  return ppVar15;
                }
              } while( true );
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvE = NULL;
    int32_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    int32_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vPosMask;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m128i*)profile->profile32.score;
    vGapO = _mm_set1_epi32(open);
    vGapE = _mm_set1_epi32(gap);
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vPosMask = _mm_cmpeq_epi32(_mm_set1_epi32(position),
            _mm_set_epi32(0,1,2,3));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad =  parasail_memalign___m128i(16, segLen);
    pvE      = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int32_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_32_t h;
            __m128i_32_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT32_MIN ? INT32_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        __m128i vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        __m128i vH = _mm_slli_si128(pvHStore[segLen - 1], 4);

        /* Correct part of the vProfile */
        const __m128i* vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        __m128i* pv = pvHLoad;
        pvHLoad = pvHStore;
        pvHStore = pv;

        /* insert upper boundary condition */
        vH = _mm_insert_epi32(vH, boundary[j], 0);

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm_add_epi32(vH, _mm_load_si128(vP + i));
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm_max_epi32(vH, vE);
            vH = _mm_max_epi32(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vF);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif

            /* Update vE value. */
            vH = _mm_sub_epi32(vH, vGapO);
            vE = _mm_sub_epi32(vE, vGapE);
            vE = _mm_max_epi32(vE, vH);
            _mm_store_si128(pvE + i, vE);

            /* Update vF value. */
            vF = _mm_sub_epi32(vF, vGapE);
            vF = _mm_max_epi32(vF, vH);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = s2_beg ? -open : (boundary[j+1]-open);
            int32_t tmp2 = tmp < INT32_MIN ? INT32_MIN : tmp;
            vF = _mm_slli_si128(vF, 4);
            vF = _mm_insert_epi32(vF, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi32(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vH = _mm_sub_epi32(vH, vGapO);
                vF = _mm_sub_epi32(vF, vGapE);
                if (! _mm_movemask_epi8(_mm_cmpgt_epi32(vF, vH))) goto end;
                /*vF = _mm_max_epi32(vF, vH);*/
            }
        }
end:
        {
            /* extract vector containing last value from the column */
            __m128i vCompare;
            vH = _mm_load_si128(pvHStore + offset);
            vCompare = _mm_and_si128(vPosMask, _mm_cmpgt_epi32(vH, vMaxH));
            vMaxH = _mm_max_epi32(vH, vMaxH);
            if (_mm_movemask_epi8(vCompare)) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 4);
            }
            result->rowcols->score_row[j] = (int32_t) _mm_extract_epi32 (vH, 3);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore + i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm_slli_si128(vMaxH, 4);
        }
        score = (int32_t) _mm_extract_epi32(vMaxH, 3);
        end_query = s1Len-1;
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int32_t *t = (int32_t*)pvHStore;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
            }
        }
    }

    if (!s1_end && !s2_end) {
        /* extract last value from the last column */
        {
            __m128i vH = _mm_load_si128(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 4);
            }
            score = (int32_t) _mm_extract_epi32 (vH, 3);
            end_ref = s2Len - 1;
            end_query = s1Len - 1;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi32(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}